

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncasecmp.c
# Opt level: O0

int nn_strncasecmp(char *a,char *b,size_t len)

{
  int iVar1;
  int iVar2;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t count;
  int rv;
  ulong local_30;
  char *local_18;
  char *local_10;
  
  local_30 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (in_RDX <= local_30) {
      return 0;
    }
    if ((*local_10 == '\0') && (*local_18 == '\0')) break;
    iVar1 = tolower((int)*local_10);
    iVar2 = tolower((int)*local_18);
    if (iVar1 - iVar2 != 0) {
      return iVar1 - iVar2;
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

int
nn_strncasecmp(const char *a, const char *b, size_t len)
{
	int rv;
	size_t count;
	for (count = 0; count < len; count++) {
		if ((*a == 0) && (*b == 0)) {
			return (0);
		}
		if ((rv = tolower(*a) - tolower(*b)) != 0) {
			return (rv);
		}
		a++;
		b++;
	}
	return (0);
}